

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool execCommand(QString *program,QStringList *args,QByteArray *output,bool verbose)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  undefined7 in_register_00000009;
  undefined8 *puVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QLatin1String QVar6;
  QArrayDataPointer<char16_t> QStack_c8;
  QArrayDataPointer<char> local_b0;
  QArrayDataPointer<char16_t> local_98;
  char *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QListSpecialMethods<QString>::join
            ((QString *)&local_98,(QListSpecialMethods<QString> *)args,(QChar)0x20);
  local_68.a.b.m_size = 1;
  local_68.a.b.m_data = " ";
  local_98.d._0_4_ = 0;
  local_98.d._4_4_ = 0;
  local_98.ptr._0_4_ = 0;
  local_98.ptr._4_4_ = 0;
  local_98.size._0_4_ = 0;
  local_98.size._4_4_ = 0;
  local_68.a.a = program;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  __stream = _stdout;
  if (((int)CONCAT71(in_register_00000009,verbose) != 0) && (g_options.verbose == true)) {
    QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
    ::toUtf8((QByteArray *)&local_98,
             (QStringBuilderBase<QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>,_QString>
              *)&local_68);
    puVar3 = (undefined8 *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
    if (puVar3 == (undefined8 *)0x0) {
      puVar3 = &QByteArray::_empty;
    }
    fprintf(__stream,"Execute %s.\n",puVar3);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  }
  local_78 = 0xaaaaaaaaaaaaaaaa;
  uStack_70 = 0xaaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_78,(QObject *)0x0);
  QProcess::start((QProcess *)&local_78,program,args,3);
  cVar1 = QProcess::waitForStarted((int)(QProcess *)&local_78);
  if (cVar1 == '\0') {
    local_98.d._0_4_ = 2;
    local_98.size._4_4_ = 0;
    local_98.d._4_4_ = 0;
    local_98.ptr._0_4_ = 0;
    local_98.ptr._4_4_ = 0;
    local_98.size._0_4_ = 0;
    local_80 = "default";
    QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>::convertTo<QString>
              ((QString *)&QStack_c8,&local_68);
    QString::toLocal8Bit((QByteArray *)&local_b0,(QString *)&QStack_c8);
    if (local_b0.ptr == (char *)0x0) {
      local_b0.ptr = (char *)&QByteArray::_empty;
    }
    pcVar4 = "Cannot execute command %s.";
  }
  else {
    QVar6.m_data = (char *)0x3;
    QVar6.m_size = (qsizetype)program;
    QString::endsWith(QVar6,0x10e734);
    cVar1 = QProcess::waitForFinished((int)&local_78);
    if (cVar1 != '\0') {
      local_98.size._0_4_ = 0xaaaaaaaa;
      local_98.size._4_4_ = 0xaaaaaaaa;
      local_98.d._0_4_ = 0xaaaaaaaa;
      local_98.d._4_4_ = 0xaaaaaaaa;
      local_98.ptr._0_4_ = 0xaaaaaaaa;
      local_98.ptr._4_4_ = 0xaaaaaaaa;
      QProcess::readAllStandardOutput();
      if (output != (QByteArray *)0x0) {
        QByteArray::append(output);
      }
      if ((verbose) && (g_options.verbose == true)) {
        puVar3 = (undefined8 *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
        if (puVar3 == (undefined8 *)0x0) {
          puVar3 = &QByteArray::_empty;
        }
        fprintf(_stdout,"%s\n",puVar3);
      }
      iVar2 = QProcess::exitCode();
      bVar5 = iVar2 == 0;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
      goto LAB_00109cdf;
    }
    local_98.d._0_4_ = 2;
    local_98.size._4_4_ = 0;
    local_98.d._4_4_ = 0;
    local_98.ptr._0_4_ = 0;
    local_98.ptr._4_4_ = 0;
    local_98.size._0_4_ = 0;
    local_80 = "default";
    QStringBuilder<QStringBuilder<const_QString_&,_QLatin1String>,_QString>::convertTo<QString>
              ((QString *)&QStack_c8,&local_68);
    QString::toLocal8Bit((QByteArray *)&local_b0,(QString *)&QStack_c8);
    if (local_b0.ptr == (char *)0x0) {
      local_b0.ptr = (char *)&QByteArray::_empty;
    }
    pcVar4 = "Execution of command %s timed out.";
  }
  bVar5 = false;
  QMessageLogger::critical((char *)&local_98,pcVar4,local_b0.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_c8);
LAB_00109cdf:
  QProcess::~QProcess((QProcess *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68.b.d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

static bool execCommand(const QString &program, const QStringList &args,
                        QByteArray *output = nullptr, bool verbose = false)
{
    const auto command = program + " "_L1 + args.join(u' ');

    if (verbose && g_options.verbose)
        fprintf(stdout,"Execute %s.\n", command.toUtf8().constData());

    QProcess process;
    process.start(program, args);
    if (!process.waitForStarted()) {
        qCritical("Cannot execute command %s.", qPrintable(command));
        return false;
    }

    // If the command is not adb, for example, make or ninja, it can take more that
    // QProcess::waitForFinished() 30 secs, so for that use a higher timeout.
    const int FinishTimeout = program.endsWith("adb"_L1) ? 30000 : g_options.timeoutSecs * 1000;
    if (!process.waitForFinished(FinishTimeout)) {
        qCritical("Execution of command %s timed out.", qPrintable(command));
        return false;
    }

    const auto stdOut = process.readAllStandardOutput();
    if (output)
        output->append(stdOut);

    if (verbose && g_options.verbose)
        fprintf(stdout, "%s\n", stdOut.constData());

    return process.exitCode() == 0;
}